

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panning.cpp
# Opt level: O3

unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_>
anon_unknown.dwarf_20794a::CreateStablizer(size_t outchans,ALuint srate)

{
  void *__s;
  unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_> uVar1;
  pointer *__ptr;
  undefined4 in_register_00000034;
  FamCount count;
  EVP_PKEY_CTX *ctx;
  undefined4 extraout_var;
  
  count = CONCAT44(in_register_00000034,srate);
  __s = FrontStablizer::operator_new(0x6420,count);
  ctx = (EVP_PKEY_CTX *)0x0;
  memset(__s,0,0x6010);
  *(FamCount *)((long)__s + 0x6010) = count;
  *(void **)outchans = __s;
  if (count != 0) {
    ctx = (EVP_PKEY_CTX *)0x0;
    memset((void *)((long)__s + 0x6020),0,count << 10);
  }
  uVar1._M_t.super___uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_>._M_t.
  super__Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>.
  super__Head_base<0UL,_FrontStablizer_*,_false>._M_head_impl._0_4_ =
       BandSplitterR<float>::init((BandSplitterR<float> *)((long)__s + 0x4000),ctx);
  uVar1._M_t.super___uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_>._M_t.
  super__Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>.
  super__Head_base<0UL,_FrontStablizer_*,_false>._M_head_impl._4_4_ = extraout_var;
  return (unique_ptr<FrontStablizer,_std::default_delete<FrontStablizer>_>)
         uVar1._M_t.super___uniq_ptr_impl<FrontStablizer,_std::default_delete<FrontStablizer>_>._M_t
         .super__Tuple_impl<0UL,_FrontStablizer_*,_std::default_delete<FrontStablizer>_>.
         super__Head_base<0UL,_FrontStablizer_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<FrontStablizer> CreateStablizer(const size_t outchans, const ALuint srate)
{
    auto stablizer = FrontStablizer::Create(outchans);
    for(auto &buf : stablizer->DelayBuf)
        std::fill(buf.begin(), buf.end(), 0.0f);

    /* Initialize band-splitting filter for the mid signal, with a crossover at
     * 5khz (could be higher).
     */
    stablizer->MidFilter.init(5000.0f / static_cast<float>(srate));

    return stablizer;
}